

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_field_gens.cc
# Opt level: O0

FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *
google::protobuf::compiler::java::MakeImmutableFieldGenerators
          (FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>
           *__return_storage_ptr__,Descriptor *descriptor,Context *context)

{
  unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
  field_00;
  int iVar1;
  pointer pIVar2;
  unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
  local_58;
  unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
  local_50;
  unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
  generator;
  FieldDescriptor *field;
  int local_30;
  int i;
  int local_24;
  int builderBitIndex;
  int messageBitIndex;
  Context *context_local;
  Descriptor *descriptor_local;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *ret;
  
  local_24 = 0;
  i = 0;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::FieldGeneratorMap
            (__return_storage_ptr__,descriptor);
  for (local_30 = 0; iVar1 = Descriptor::field_count(descriptor), local_30 < iVar1;
      local_30 = local_30 + 1) {
    generator._M_t.
    super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
    .super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>.
    _M_head_impl = (__uniq_ptr_data<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>,_true,_true>
                    )Descriptor::field(descriptor,local_30);
    anon_unknown_16::MakeImmutableGenerator
              ((anon_unknown_16 *)&local_50,
               (FieldDescriptor *)
               generator._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
               .
               super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
               ._M_head_impl,local_24,i,context);
    pIVar2 = std::
             unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
             ::operator->(&local_50);
    iVar1 = (*(pIVar2->super_FieldGenerator)._vptr_FieldGenerator[5])();
    local_24 = local_24 + iVar1;
    pIVar2 = std::
             unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
             ::operator->(&local_50);
    iVar1 = (*(pIVar2->super_FieldGenerator)._vptr_FieldGenerator[6])();
    field_00 = generator;
    i = i + iVar1;
    std::
    unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
    ::unique_ptr(&local_58,&local_50);
    FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::Add
              (__return_storage_ptr__,
               (FieldDescriptor *)
               field_00._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
               .
               super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
               ._M_head_impl,&local_58);
    std::
    unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
    ::~unique_ptr(&local_58);
    std::
    unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
    ::~unique_ptr(&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

FieldGeneratorMap<ImmutableFieldGenerator> MakeImmutableFieldGenerators(
    const Descriptor* descriptor, Context* context) {
  // Construct all the FieldGenerators and assign them bit indices for their
  // bit fields.
  int messageBitIndex = 0;
  int builderBitIndex = 0;
  FieldGeneratorMap<ImmutableFieldGenerator> ret(descriptor);
  for (int i = 0; i < descriptor->field_count(); i++) {
    const FieldDescriptor* field = descriptor->field(i);
    auto generator = MakeImmutableGenerator(field, messageBitIndex,
                                            builderBitIndex, context);
    messageBitIndex += generator->GetNumBitsForMessage();
    builderBitIndex += generator->GetNumBitsForBuilder();
    ret.Add(field, std::move(generator));
  }
  return ret;
}